

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

bool pbrt::upgradeRGBToScale(ParameterDictionary *dict,char *name,Float *totalScale)

{
  Allocator alloc;
  RGB *pRVar1;
  bool bVar2;
  allocator<char> local_65;
  float local_64;
  optional<pbrt::RGB> rgb;
  string local_50;
  vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> s;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,name,(allocator<char> *)&rgb);
  alloc.memoryResource = pstd::pmr::new_delete_resource();
  ParameterDictionary::GetSpectrumArray(&s,dict,&local_50,Unbounded,alloc);
  std::__cxx11::string::~string((string *)&local_50);
  if (s.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>._M_impl.
      super__Vector_impl_data._M_start ==
      s.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar2 = true;
    goto LAB_0034cd29;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_65);
  ParameterDictionary::GetOneRGB((ParameterDictionary *)&rgb,(string *)dict);
  std::__cxx11::string::~string((string *)&local_50);
  if (rgb.set == true) {
    pRVar1 = pstd::optional<pbrt::RGB>::value(&rgb);
    local_64 = pRVar1->r;
    pRVar1 = pstd::optional<pbrt::RGB>::value(&rgb);
    if ((local_64 != pRVar1->g) || (NAN(local_64) || NAN(pRVar1->g))) goto LAB_0034cd19;
    pRVar1 = pstd::optional<pbrt::RGB>::value(&rgb);
    local_64 = pRVar1->g;
    pRVar1 = pstd::optional<pbrt::RGB>::value(&rgb);
    if ((local_64 != pRVar1->b) || (NAN(local_64) || NAN(pRVar1->b))) goto LAB_0034cd19;
    pRVar1 = pstd::optional<pbrt::RGB>::value(&rgb);
    *totalScale = pRVar1->r * *totalScale;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_65);
    ParameterDictionary::RemoveSpectrum(dict,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    bVar2 = true;
  }
  else {
LAB_0034cd19:
    bVar2 = false;
  }
  pstd::optional<pbrt::RGB>::~optional(&rgb);
LAB_0034cd29:
  std::_Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::~_Vector_base
            (&s.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>);
  return bVar2;
}

Assistant:

static bool upgradeRGBToScale(ParameterDictionary *dict, const char *name,
                              Float *totalScale) {
    std::vector<SpectrumHandle> s =
        dict->GetSpectrumArray(name, SpectrumType::Unbounded, {});
    if (s.empty())
        return true;

    pstd::optional<RGB> rgb = dict->GetOneRGB(name);
    if (!rgb || rgb->r != rgb->g || rgb->g != rgb->b)
        return false;

    *totalScale *= rgb->r;
    dict->RemoveSpectrum(name);
    return true;
}